

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccmake.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  short sVar2;
  short sVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  char **argv_00;
  long lVar9;
  ostream *poVar10;
  cmCursesMainForm *this;
  long *plVar11;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 collapse;
  ulong uVar12;
  ulong uVar13;
  string arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> generators;
  CommandLineArguments encoding_args;
  cmDocumentation doc;
  string cacheDir;
  string local_508;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  undefined1 local_4d0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b0;
  CommandLineArguments local_498;
  _Any_data local_480;
  code *local_470;
  code *local_468;
  cmDocumentation local_460;
  undefined1 local_3b8 [904];
  
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments::Main(&local_498,argc,argv);
  uVar7 = cmsys::Encoding::CommandLineArguments::argc(&local_498);
  argv_00 = cmsys::Encoding::CommandLineArguments::argv(&local_498);
  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(*argv_00);
  cmDocumentation::cmDocumentation(&local_460);
  cmDocumentation::addCMakeStandardDocSections(&local_460);
  bVar6 = cmDocumentation::CheckOptions(&local_460,uVar7,argv_00,(char *)0x0);
  if (bVar6) {
    cmake::cmake((cmake *)local_3b8,RoleInternal,Unknown);
    paVar1 = &local_508.field_2;
    local_508._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
    cmake::SetHomeDirectory((cmake *)local_3b8,&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != paVar1) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    local_508._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"");
    cmake::SetHomeOutputDirectory((cmake *)local_3b8,&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != paVar1) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    cmake::AddCMakePaths((cmake *)local_3b8);
    cmake::GetGeneratorsDocumentation
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d0,
               (cmake *)local_3b8);
    local_508._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"ccmake","");
    cmDocumentation::SetName(&local_460,&local_508);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_508._M_dataplus._M_p != paVar1) {
      operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
    }
    cmDocumentation::SetSection(&local_460,"Name",cmDocumentationName);
    cmDocumentation::SetSection(&local_460,"Usage",cmDocumentationUsage);
    if (uVar7 == 1) {
      cmDocumentation::AppendSection(&local_460,"Usage",cmDocumentationUsageNote);
    }
    cmDocumentation::AppendSection
              (&local_460,"Generators",
               (vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d0);
    cmDocumentation::PrependSection(&local_460,"Options",cmDocumentationOptions);
    bVar6 = cmDocumentation::PrintRequestedDocumentation(&local_460,(ostream *)&std::cout);
    uVar7 = (uint)!bVar6;
    std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::~vector
              ((vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *)local_4d0);
    cmake::~cmake((cmake *)local_3b8);
    goto LAB_0014636d;
  }
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((int)uVar7 < 1) {
    bVar6 = false;
    collapse = extraout_DL;
  }
  else {
    uVar12 = (ulong)uVar7;
    bVar6 = false;
    do {
      iVar8 = strcmp(*argv_00,"-debug");
      if (iVar8 == 0) {
        bVar6 = true;
        collapse = extraout_DL_00;
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_4e8,
                   argv_00);
        collapse = extraout_DL_01;
      }
      argv_00 = argv_00 + 1;
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)local_3b8,(SystemTools *)0x1,(bool)collapse);
  if (0x20 < (ulong)((long)local_4e8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_4e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar12 = 1;
    uVar13 = 2;
    do {
      pcVar4 = local_4e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p;
      local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_508,pcVar4,
                 pcVar4 + local_4e8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_string_length);
      lVar9 = std::__cxx11::string::find((char *)&local_508,0x4e4bfc,0);
      if (lVar9 == 0) {
        std::__cxx11::string::substr((ulong)local_4d0,(ulong)&local_508);
        std::__cxx11::string::operator=((string *)local_3b8,(string *)local_4d0);
        if ((pointer)local_4d0._0_8_ != (pointer)(local_4d0 + 0x10)) {
          operator_delete((void *)local_4d0._0_8_,
                          (ulong)((long)&(((string *)local_4d0._16_8_)->_M_dataplus)._M_p + 1));
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_dataplus._M_p != &local_508.field_2) {
        operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
      }
      bVar5 = uVar13 < (ulong)((long)local_4e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_4e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar12 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar5);
  }
  cmSystemTools::s_DisableRunCommandOutput = true;
  if (bVar6) {
    cmCursesForm::DebugStart();
  }
  initscr();
  noecho();
  cbreak();
  keypad(_stdscr,1);
  signal(0x1c,onsig);
  if (_stdscr == 0) {
LAB_001460b1:
    endwin();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Window is too small. A size of at least ",0x28);
    poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,0x41);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," x ",3);
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," is required to run ccmake.",0x1b);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    uVar7 = 1;
    std::ostream::flush();
  }
  else {
    sVar2 = *(short *)(_stdscr + 4);
    sVar3 = *(short *)(_stdscr + 6);
    if (sVar2 < 5 || sVar3 < 0x40) goto LAB_001460b1;
    this = (cmCursesMainForm *)operator_new(0x110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_4b0,&local_4e8);
    uVar7 = (int)sVar3 + 1;
    cmCursesMainForm::cmCursesMainForm(this,&local_4b0,uVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4b0);
    iVar8 = cmCursesMainForm::LoadCache(this,(char *)local_3b8._0_8_);
    if (iVar8 == 0) {
      local_480._8_8_ = 0;
      local_468 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/ccmake.cxx:154:5)>
                  ::_M_invoke;
      local_470 = std::
                  _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/ccmake.cxx:154:5)>
                  ::_M_manager;
      local_480._M_unused._0_8_ = (undefined8)this;
      cmSystemTools::SetMessageCallback((MessageCallback *)&local_480);
      if (local_470 != (code *)0x0) {
        (*local_470)(&local_480,&local_480,__destroy_functor);
      }
      cmCursesForm::CurrentForm = (cmCursesForm *)this;
      cmCursesMainForm::InitializeUI(this);
      iVar8 = cmCursesMainForm::Configure(this,1);
      if (iVar8 == 0) {
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                  (this,1,1,(ulong)uVar7,(ulong)((int)sVar2 + 1));
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[2])(this);
      }
      erase();
      clearok(_stdscr,1);
      if (_stdscr == 0) {
        iVar8 = -1;
      }
      else {
        iVar8 = *(short *)(_stdscr + 4) + 1;
      }
      wtouchln(_stdscr,0,iVar8,1);
      endwin();
      if (cmCursesForm::CurrentForm != (cmCursesForm *)0x0) {
        (*cmCursesForm::CurrentForm->_vptr_cmCursesForm[1])();
      }
      cmCursesForm::CurrentForm = (cmCursesForm *)0x0;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      plVar11 = (long *)std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*plVar11 + -0x18) + (char)plVar11);
      std::ostream::put((char)plVar11);
      uVar7 = 0;
      std::ostream::flush();
    }
    else {
      erase();
      clearok(_stdscr,1);
      if (_stdscr == 0) {
        iVar8 = -1;
      }
      else {
        iVar8 = *(short *)(_stdscr + 4) + 1;
      }
      wtouchln(_stdscr,0,iVar8,1);
      endwin();
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[1])(this);
      uVar7 = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error running cmake::LoadCache().  Aborting.\n",0x2d);
    }
  }
  if ((undefined1 *)local_3b8._0_8_ != local_3b8 + 0x10) {
    operator_delete((void *)local_3b8._0_8_,local_3b8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4e8);
LAB_0014636d:
  cmDocumentationFormatter::~cmDocumentationFormatter(&local_460.Formatter);
  std::
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>::
  ~vector(&local_460.RequestedHelpItems);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.CurrentArgument._M_dataplus._M_p != &local_460.CurrentArgument.field_2) {
    operator_delete(local_460.CurrentArgument._M_dataplus._M_p,
                    local_460.CurrentArgument.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection>_>_>
  ::~_Rb_tree(&local_460.AllSections._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.NameString._M_dataplus._M_p != &local_460.NameString.field_2) {
    operator_delete(local_460.NameString._M_dataplus._M_p,
                    local_460.NameString.field_2._M_allocated_capacity + 1);
  }
  cmsys::Encoding::CommandLineArguments::~CommandLineArguments(&local_498);
  return uVar7;
}

Assistant:

int main(int argc, char const* const* argv)
{
  cmSystemTools::EnsureStdPipes();
  cmsys::Encoding::CommandLineArguments encoding_args =
    cmsys::Encoding::CommandLineArguments::Main(argc, argv);
  argc = encoding_args.argc();
  argv = encoding_args.argv();

  cmSystemTools::InitializeLibUV();
  cmSystemTools::FindCMakeResources(argv[0]);
  cmDocumentation doc;
  doc.addCMakeStandardDocSections();
  if (doc.CheckOptions(argc, argv)) {
    cmake hcm(cmake::RoleInternal, cmState::Unknown);
    hcm.SetHomeDirectory("");
    hcm.SetHomeOutputDirectory("");
    hcm.AddCMakePaths();
    auto generators = hcm.GetGeneratorsDocumentation();
    doc.SetName("ccmake");
    doc.SetSection("Name", cmDocumentationName);
    doc.SetSection("Usage", cmDocumentationUsage);
    if (argc == 1) {
      doc.AppendSection("Usage", cmDocumentationUsageNote);
    }
    doc.AppendSection("Generators", generators);
    doc.PrependSection("Options", cmDocumentationOptions);
    return doc.PrintRequestedDocumentation(std::cout) ? 0 : 1;
  }

  bool debug = false;
  unsigned int i;
  int j;
  std::vector<std::string> args;
  for (j = 0; j < argc; ++j) {
    if (strcmp(argv[j], "-debug") == 0) {
      debug = true;
    } else {
      args.emplace_back(argv[j]);
    }
  }

  std::string cacheDir = cmSystemTools::GetCurrentWorkingDirectory();
  for (i = 1; i < args.size(); ++i) {
    std::string arg = args[i];
    if (arg.find("-B", 0) == 0) {
      cacheDir = arg.substr(2);
    }
  }

  cmSystemTools::DisableRunCommandOutput();

  if (debug) {
    cmCursesForm::DebugStart();
  }

  initscr();            /* Initialization */
  noecho();             /* Echo off */
  cbreak();             /* nl- or cr not needed */
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  signal(SIGWINCH, onsig);

  int x, y;
  getmaxyx(stdscr, y, x);
  if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
    endwin();
    std::cerr << "Window is too small. A size of at least "
              << cmCursesMainForm::MIN_WIDTH << " x "
              << cmCursesMainForm::MIN_HEIGHT << " is required to run ccmake."
              << std::endl;
    return 1;
  }

  cmCursesMainForm* myform;

  myform = new cmCursesMainForm(args, x);
  if (myform->LoadCache(cacheDir.c_str())) {
    curses_clear();
    touchwin(stdscr);
    endwin();
    delete myform;
    std::cerr << "Error running cmake::LoadCache().  Aborting.\n";
    return 1;
  }

  cmSystemTools::SetMessageCallback(
    [myform](const std::string& message, const char* title) {
      myform->AddError(message, title);
    });

  cmCursesForm::CurrentForm = myform;

  myform->InitializeUI();
  if (myform->Configure(1) == 0) {
    myform->Render(1, 1, x, y);
    myform->HandleInput();
  }

  // Need to clean-up better
  curses_clear();
  touchwin(stdscr);
  endwin();
  delete cmCursesForm::CurrentForm;
  cmCursesForm::CurrentForm = nullptr;

  std::cout << std::endl << std::endl;

  return 0;
}